

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

void test_send_multiple_jobs_starting_with_close(void)

{
  cio_websocket *websocket;
  _Bool _Var1;
  cio_error cVar2;
  size_t frame_length;
  undefined1 local_108 [4];
  cio_error err;
  cio_write_buffer wb;
  cio_write_buffer text_wbh;
  cio_write_buffer pong_wbh;
  cio_write_buffer ping_wbh;
  char buffer [125];
  
  memset((void *)((long)&ping_wbh.data + 8),0,0x7d);
  ping_wbh.data.element.length._0_1_ = 0x61;
  cio_buffered_stream_write_fake.custom_fake = bs_write_later;
  cio_write_buffer_head_init((cio_write_buffer *)((long)&pong_wbh.data + 8));
  cio_write_buffer_head_init((cio_write_buffer *)((long)&text_wbh.data + 8));
  cio_write_buffer_head_init((cio_write_buffer *)((long)&wb.data + 8));
  cio_write_buffer_element_init
            ((cio_write_buffer *)local_108,(void *)((long)&ping_wbh.data + 8),0x7d);
  cio_write_buffer_queue_tail
            ((cio_write_buffer *)((long)&wb.data + 8),(cio_write_buffer *)local_108);
  cVar2 = cio_websocket_close(ws,CIO_WEBSOCKET_CLOSE_NORMAL,(char *)0x0,write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Writing a close frame did not succeed!",0xb16,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_websocket_write_ping
                    (ws,(cio_write_buffer *)((long)&pong_wbh.data + 8),write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Writing a ping frame did not succeed!",0xb18,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_websocket_write_pong
                    (ws,(cio_write_buffer *)((long)&text_wbh.data + 8),write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Writing a pong frame did not succeed!",0xb1a,UNITY_DISPLAY_STYLE_INT);
  websocket = ws;
  frame_length = cio_write_buffer_get_total_size((cio_write_buffer *)((long)&wb.data + 8));
  cVar2 = cio_websocket_write_message_first_chunk
                    (websocket,frame_length,(cio_write_buffer *)((long)&wb.data + 8),true,false,
                     write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Writing a text frame did not succeed!",0xb1c,UNITY_DISPLAY_STYLE_INT);
  cio_buffered_stream_write_fake.custom_fake = bs_write_ok;
  bs_write_ok(write_later_bs,write_later_buf,write_later_handler,write_later_handler_context);
  UnityAssertEqualNumber
            (4,(ulong)write_handler_fake.call_count,"Write handler was not called",0xb22,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[0],
             "websocket parameter of write_handler not correct",0xb23,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[0] != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0xb24);
  }
  UnityAssertEqualNumber
            (0,(long)write_handler_fake.arg2_history[3],"err parameter of write_handler not correct"
             ,0xb25,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[1],
             "websocket parameter of write_handler not correct",0xb26,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[1] != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0xb27);
  }
  UnityAssertEqualNumber
            (-0x7d,(long)write_handler_fake.arg2_history[0],
             "err parameter of write_handler not correct",0xb28,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[2],
             "websocket parameter of write_handler not correct",0xb29,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[2] != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0xb2a);
  }
  UnityAssertEqualNumber
            (-0x7d,(long)write_handler_fake.arg2_history[1],
             "err parameter of write_handler not correct",0xb2b,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[3],
             "websocket parameter of write_handler not correct",0xb2c,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[3] == (void *)0x0) {
    UnityAssertEqualNumber
              (-0x7d,(long)write_handler_fake.arg2_history[2],
               "err parameter of write_handler not correct",0xb2e,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,(ulong)on_error_fake.call_count,"error callback was called",0xb30,
               UNITY_DISPLAY_STYLE_INT);
    _Var1 = is_close_frame(1000,true);
    if (!_Var1) {
      UnityFail("Written close frame not correct",0xb32);
    }
    return;
  }
  UnityFail("context parameter of write_handler not NULL",0xb2d);
}

Assistant:

static void test_send_multiple_jobs_starting_with_close(void)
{
	char buffer[125] = {'a'};

	cio_buffered_stream_write_fake.custom_fake = bs_write_later;

	struct cio_write_buffer ping_wbh;
	cio_write_buffer_head_init(&ping_wbh);
	struct cio_write_buffer pong_wbh;
	cio_write_buffer_head_init(&pong_wbh);
	struct cio_write_buffer text_wbh;
	cio_write_buffer_head_init(&text_wbh);

	struct cio_write_buffer wb;
	cio_write_buffer_element_init(&wb, buffer, sizeof(buffer));
	cio_write_buffer_queue_tail(&text_wbh, &wb);

	enum cio_error err = cio_websocket_close(ws, CIO_WEBSOCKET_CLOSE_NORMAL, NULL, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a close frame did not succeed!");
	err = cio_websocket_write_ping(ws, &ping_wbh, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a ping frame did not succeed!");
	err = cio_websocket_write_pong(ws, &pong_wbh, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a pong frame did not succeed!");
	err = cio_websocket_write_message_first_chunk(ws, cio_write_buffer_get_total_size(&text_wbh), &text_wbh, true, false, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a text frame did not succeed!");

	// Simulate write call over the eventloop
	cio_buffered_stream_write_fake.custom_fake = bs_write_ok;
	bs_write_ok(write_later_bs, write_later_buf, write_later_handler, write_later_handler_context);

	TEST_ASSERT_EQUAL_MESSAGE(4, write_handler_fake.call_count, "Write handler was not called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[0], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[0], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, write_handler_fake.arg2_history[3], "err parameter of write_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[1], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[1], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_OPERATION_ABORTED, write_handler_fake.arg2_history[0], "err parameter of write_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[2], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[2], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_OPERATION_ABORTED, write_handler_fake.arg2_history[1], "err parameter of write_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[3], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[3], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_OPERATION_ABORTED, write_handler_fake.arg2_history[2], "err parameter of write_handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");

	TEST_ASSERT_TRUE_MESSAGE(is_close_frame(CIO_WEBSOCKET_CLOSE_NORMAL, true), "Written close frame not correct");
}